

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

problem * baryonyx::affect(problem *__return_storage_ptr__,context *ctx,problem *pb,
                          int variable_index,bool variable_value)

{
  pointer pbVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  preprocessor<baryonyx::problem> pp;
  bool local_121;
  uint local_120 [2];
  double local_118;
  undefined1 local_110 [224];
  
  auVar6 = in_ZMM0._0_16_;
  local_121 = variable_value;
  if ((-1 < variable_index) &&
     (variable_index <
      (int)((ulong)((long)(pb->vars).values.
                          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pb->vars).values.
                         super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555)) {
    pbVar1 = (pb->vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar5 = memory_consumed(pb);
    auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
    local_120[0] = 0;
    dVar2 = auVar6._0_8_ * 0.0009765625;
    dVar3 = dVar2 * 0.0009765625;
    local_118 = dVar3 * 0.0009765625;
    if ((dVar3 * 0.0009765625 <= 0.5) && (local_120[0] = 1, local_118 = dVar3, dVar3 <= 0.5)) {
      bVar4 = 0.5 < dVar2;
      local_120[0] = bVar4 ^ 3;
      local_118 = (double)((ulong)bVar4 * (long)dVar2 + (ulong)!bVar4 * (long)auVar6._0_8_);
    }
    to_string_abi_cxx11_((string *)local_110,(baryonyx *)local_120,mem);
    info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
              (ctx,"  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
               pbVar1 + (uint)variable_index,&local_121,(string *)local_110);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    anon_unknown.dwarf_118f92::preprocessor<baryonyx::problem>::preprocessor
              ((preprocessor<baryonyx::problem> *)local_110,ctx,pb);
    anon_unknown.dwarf_118f92::preprocessor<baryonyx::problem>::operator()
              (__return_storage_ptr__,(preprocessor<baryonyx::problem> *)local_110,variable_index,
               local_121);
    anon_unknown.dwarf_118f92::preprocessor<baryonyx::problem>::~preprocessor
              ((preprocessor<baryonyx::problem> *)local_110);
    return __return_storage_ptr__;
  }
  affect();
  anon_unknown.dwarf_118f92::preprocessor<baryonyx::problem>::~preprocessor
            ((preprocessor<baryonyx::problem> *)local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

problem
affect(const context& ctx,
       const problem& pb,
       int variable_index,
       bool variable_value)
{
    bx_expects(variable_index >= 0 && variable_index < length(pb.vars.values));

    info(
      ctx,
      "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
      pb.vars.names[variable_index],
      variable_value,
      to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return pp(variable_index, variable_value);
}